

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

UniValue * read_json(UniValue *__return_storage_ptr__,string_view jsondata)

{
  long lVar1;
  ssize_t sVar2;
  UniValue *pUVar3;
  size_t in_RCX;
  long in_FS_OFFSET;
  bool local_69;
  UniValue v;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  v.val._M_dataplus._M_p = (pointer)&v.val.field_2;
  v.val._M_string_length = 0;
  v.val.field_2._M_local_buf[0] = '\0';
  v.typ = VNULL;
  v.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  v.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  v.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar2 = UniValue::read(&v,(int)jsondata._M_len,jsondata._M_str,in_RCX);
  local_69 = (bool)((byte)sVar2 & v.typ == VARR);
  inline_assertion_check<true,bool>
            (&local_69,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/json.cpp"
             ,0xf,"read_json","v.read(jsondata) && v.isArray()");
  pUVar3 = UniValue::get_array(&v);
  UniValue::UniValue(__return_storage_ptr__,pUVar3);
  UniValue::~UniValue(&v);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue read_json(std::string_view jsondata)
{
    UniValue v;
    Assert(v.read(jsondata) && v.isArray());
    return v.get_array();
}